

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O3

void __thiscall DBot::WhatToGet(DBot *this,AActor *item)

{
  APlayerPawn *pAVar1;
  AAmmo *pAVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  AActor *pAVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AInventory *pAVar6;
  AWeapon *pAVar7;
  undefined4 extraout_var_01;
  PClassActor *pPVar8;
  PClass *pPVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  PClass *pPVar10;
  undefined4 extraout_var_04;
  PClassActor *pPVar11;
  AAmmo *ammo;
  bool bVar12;
  bool bVar13;
  FName local_28;
  FName local_24;
  
  local_24.Index = (int)((ulong)in_RAX >> 0x20);
  if (((item->renderflags).Value & 0x8000) != 0) {
    return;
  }
  pAVar5 = (this->prev).field_0.p;
  if (pAVar5 == (AActor *)0x0) {
LAB_0034fbc3:
    pAVar5 = (AActor *)0x0;
  }
  else if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->prev).field_0.p = (AActor *)0x0;
    goto LAB_0034fbc3;
  }
  pPVar10 = AWeapon::RegistrationInfo.MyClass;
  if (pAVar5 == item) {
    return;
  }
  if ((alwaysapplydmflags.Value == false) && (deathmatch.Value == 0)) {
    bVar13 = false;
  }
  else {
    bVar13 = ((byte)dmflags.Value & 4) == 0;
  }
  pPVar8 = (PClassActor *)(item->super_DThinker).super_DObject.Class;
  if (pPVar8 == (PClassActor *)0x0) {
    iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar8 = (PClassActor *)CONCAT44(extraout_var,iVar3);
    (item->super_DThinker).super_DObject.Class = (PClass *)pPVar8;
  }
  pPVar9 = AAmmo::RegistrationInfo.MyClass;
  bVar12 = pPVar8 != (PClassActor *)0x0;
  pPVar11 = pPVar8;
  if (pPVar8 != (PClassActor *)pPVar10 && bVar12) {
    do {
      pPVar11 = (PClassActor *)(pPVar11->super_PClass).ParentClass;
      bVar12 = pPVar11 != (PClassActor *)0x0;
      if (pPVar11 == (PClassActor *)pPVar10) break;
    } while (pPVar11 != (PClassActor *)0x0);
  }
  if (bVar12) {
    pAVar1 = this->player->mo;
    if (pPVar8 == (PClassActor *)0x0) {
      iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      pPVar8 = (PClassActor *)CONCAT44(extraout_var_00,iVar3);
      (item->super_DThinker).super_DObject.Class = (PClass *)pPVar8;
    }
    pAVar6 = AActor::FindInventory(&pAVar1->super_AActor,pPVar8,false);
    pAVar7 = dyn_cast<AWeapon>((DObject *)pAVar6);
    if (pAVar7 != (AWeapon *)0x0) {
      if (!bVar13) {
        return;
      }
      pAVar2 = (pAVar7->Ammo1).field_0.p;
      if (pAVar2 != (AAmmo *)0x0) {
        if (((pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20
            ) == 0) {
          if ((pAVar2->super_AInventory).Amount < (pAVar2->super_AInventory).MaxAmount)
          goto LAB_0034fef2;
        }
        else {
          (pAVar7->Ammo1).field_0.p = (AAmmo *)0x0;
        }
      }
      pAVar2 = (pAVar7->Ammo2).field_0.p;
      if (pAVar2 == (AAmmo *)0x0) {
        return;
      }
      if (((pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.ObjectFlags & 0x20)
          != 0) {
        (pAVar7->Ammo2).field_0.p = (AAmmo *)0x0;
        return;
      }
      if ((pAVar2->super_AInventory).MaxAmount <= (pAVar2->super_AInventory).Amount) {
        return;
      }
    }
    goto LAB_0034fef2;
  }
  if (pPVar8 == (PClassActor *)0x0) {
    iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar8 = (PClassActor *)CONCAT44(extraout_var_01,iVar3);
    (item->super_DThinker).super_DObject.Class = (PClass *)pPVar8;
  }
  bVar13 = pPVar8 != (PClassActor *)0x0;
  if (pPVar8 != (PClassActor *)pPVar9 && bVar13) {
    do {
      pPVar8 = (PClassActor *)(pPVar8->super_PClass).ParentClass;
      bVar13 = pPVar8 != (PClassActor *)0x0;
      if (pPVar8 == (PClassActor *)pPVar9) break;
    } while (pPVar8 != (PClassActor *)0x0);
  }
  if (bVar13) {
    pPVar8 = AAmmo::GetParentAmmo((AAmmo *)item);
    pAVar6 = AActor::FindInventory(&this->player->mo->super_AActor,pPVar8,false);
    if ((pAVar6 != (AInventory *)0x0) && (pAVar6->MaxAmount <= pAVar6->Amount)) {
      return;
    }
    goto LAB_0034fef2;
  }
  iVar3 = FName::NameManager::FindName(&FName::NameData,"Megasphere",true);
  _local_28 = CONCAT44(local_24.Index,iVar3);
  pPVar9 = PClass::FindClass(&local_28);
  pPVar10 = (item->super_DThinker).super_DObject.Class;
  if (pPVar10 == (PClass *)0x0) {
    iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar10 = (PClass *)CONCAT44(extraout_var_02,iVar3);
    (item->super_DThinker).super_DObject.Class = pPVar10;
  }
  bVar13 = pPVar10 != (PClass *)0x0;
  if (pPVar10 != pPVar9 && bVar13) {
    do {
      pPVar10 = pPVar10->ParentClass;
      bVar13 = pPVar10 != (PClass *)0x0;
      if (pPVar10 == pPVar9) break;
    } while (pPVar10 != (PClass *)0x0);
  }
  if (bVar13) {
LAB_0034fe36:
    if (deh.MaxSoulsphere <= (this->player->mo->super_AActor).health) {
      return;
    }
  }
  else {
    iVar3 = FName::NameManager::FindName(&FName::NameData,"Soulsphere",true);
    _local_28 = CONCAT44(iVar3,local_28.Index);
    pPVar9 = PClass::FindClass(&local_24);
    pPVar10 = (item->super_DThinker).super_DObject.Class;
    if (pPVar10 == (PClass *)0x0) {
      iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
      pPVar10 = (PClass *)CONCAT44(extraout_var_03,iVar3);
      (item->super_DThinker).super_DObject.Class = pPVar10;
    }
    bVar13 = pPVar10 != (PClass *)0x0;
    if (pPVar10 != pPVar9 && bVar13) {
      do {
        pPVar10 = pPVar10->ParentClass;
        bVar13 = pPVar10 != (PClass *)0x0;
        if (pPVar10 == pPVar9) break;
      } while (pPVar10 != (PClass *)0x0);
    }
    if (bVar13) goto LAB_0034fe36;
    pPVar10 = PClass::FindClass("HealthBonus");
    bVar13 = DObject::IsKindOf((DObject *)item,pPVar10);
    if (bVar13) goto LAB_0034fe36;
  }
  pPVar9 = AHealth::RegistrationInfo.MyClass;
  pPVar10 = (item->super_DThinker).super_DObject.Class;
  if (pPVar10 == (PClass *)0x0) {
    iVar3 = (**(item->super_DThinker).super_DObject._vptr_DObject)(item);
    pPVar10 = (PClass *)CONCAT44(extraout_var_04,iVar3);
    (item->super_DThinker).super_DObject.Class = pPVar10;
  }
  bVar13 = pPVar10 != (PClass *)0x0;
  if (pPVar10 != pPVar9 && bVar13) {
    do {
      pPVar10 = pPVar10->ParentClass;
      bVar13 = pPVar10 != (PClass *)0x0;
      if (pPVar10 == pPVar9) break;
    } while (pPVar10 != (PClass *)0x0);
  }
  if ((bVar13) &&
     (pAVar1 = this->player->mo, iVar3 = (pAVar1->super_AActor).health,
     iVar4 = APlayerPawn::GetMaxHealth(pAVar1),
     iVar4 + (this->player->mo->super_AActor).stamina <= iVar3)) {
    return;
  }
LAB_0034fef2:
  pAVar5 = (this->dest).field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (((pAVar5->flags).Value & 1) != 0) {
        return;
      }
    }
    else {
      pAVar5 = (AActor *)0x0;
    }
  }
  (this->prev).field_0.p = pAVar5;
  (this->dest).field_0.p = item;
  this->t_roam = 0x8c;
  return;
}

Assistant:

void DBot::WhatToGet (AActor *item)
{
#define typeis(x) item->IsKindOf (PClass::FindClass (#x))
	if ((item->renderflags & RF_INVISIBLE) //Under respawn and away.
		|| item == prev)
	{
		return;
	}
	int weapgiveammo = (alwaysapplydmflags || deathmatch) && !(dmflags & DF_WEAPONS_STAY);

	//if(pos && !bglobal.thingvis[pos->id][item->id]) continue;
//	if (item->IsKindOf (RUNTIME_CLASS(AArtifact)))
//		return;	// don't know how to use artifacts
	if (item->IsKindOf (RUNTIME_CLASS(AWeapon)))
	{
		// FIXME
		AWeapon *heldWeapon;

		heldWeapon = dyn_cast<AWeapon>(player->mo->FindInventory(item->GetClass()));
		if (heldWeapon != NULL)
		{
			if (!weapgiveammo)
				return;
			if ((heldWeapon->Ammo1 == NULL || heldWeapon->Ammo1->Amount >= heldWeapon->Ammo1->MaxAmount) &&
				(heldWeapon->Ammo2 == NULL || heldWeapon->Ammo2->Amount >= heldWeapon->Ammo2->MaxAmount))
			{
				return;
			}
		}
	}
	else if (item->IsKindOf (RUNTIME_CLASS(AAmmo)))
	{
		AAmmo *ammo = static_cast<AAmmo *> (item);
		PClassActor *parent = ammo->GetParentAmmo ();
		AInventory *holdingammo = player->mo->FindInventory (parent);

		if (holdingammo != NULL && holdingammo->Amount >= holdingammo->MaxAmount)
		{
			return;
		}
	}
	else if ((typeis (Megasphere) || typeis (Soulsphere) || typeis (HealthBonus)) && player->mo->health >= deh.MaxSoulsphere)
		return;
	else if (item->IsKindOf (RUNTIME_CLASS(AHealth)) && player->mo->health >= player->mo->GetMaxHealth() + player->mo->stamina)
		return;

	if ((dest == NULL ||
		!(dest->flags & MF_SPECIAL)/* ||
		!Reachable (dest)*/)/* &&
		Reachable (item)*/)	// Calling Reachable slows this down tremendously
	{
		prev = dest;
		dest = item;
		t_roam = MAXROAM;
	}
}